

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.h
# Opt level: O2

void __thiscall re2::Regexp::AllocSub(Regexp *this,int n)

{
  ostream *this_00;
  Regexp **ppRVar1;
  LogMessageFatal local_190;
  
  if (0xffff < (uint)n) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h",0x1ee
              );
    this_00 = std::operator<<((ostream *)&local_190.super_LogMessage.str_,"Cannot AllocSub ");
    std::ostream::operator<<(this_00,n);
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  if (1 < n) {
    ppRVar1 = (Regexp **)operator_new__((ulong)(uint)n << 3);
    (this->field_5).submany_ = ppRVar1;
  }
  this->nsub_ = (uint16)n;
  return;
}

Assistant:

void AllocSub(int n) {
    if (n < 0 || static_cast<uint16>(n) != n)
      LOG(FATAL) << "Cannot AllocSub " << n;
    if (n > 1)
      submany_ = new Regexp*[n];
    nsub_ = n;
  }